

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void cteClear(sqlite3 *db,Cte *pCte)

{
  sqlite3ExprListDelete(db,pCte->pCols);
  sqlite3SelectDelete(db,pCte->pSelect);
  sqlite3DbFree(db,pCte->zName);
  return;
}

Assistant:

static void cteClear(sqlite3 *db, Cte *pCte){
  assert( pCte!=0 );
  sqlite3ExprListDelete(db, pCte->pCols);
  sqlite3SelectDelete(db, pCte->pSelect);
  sqlite3DbFree(db, pCte->zName);
}